

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

TypeNames * __thiscall
wasm::PrintSExpression::TypePrinter::getNames
          (TypeNames *__return_storage_ptr__,TypePrinter *this,HeapType type)

{
  Module *pMVar1;
  char *pcVar2;
  size_t sVar3;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> _Var4;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_28;
  key_type local_20;
  HeapType type_local;
  
  pMVar1 = this->parent->currModule;
  local_20.id = type.id;
  if ((pMVar1 == (Module *)0x0) ||
     ((_Var4._M_cur = (__node_type *)
                      std::
                      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(pMVar1->typeNames)._M_h,&local_20),
      _Var4._M_cur == (__node_type *)0x0 &&
      (_Var4._M_cur = (__node_type *)
                      std::
                      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(this->fallbackNames)._M_h,&local_20),
      _Var4._M_cur == (__node_type *)0x0)))) {
    DefaultTypeNameGenerator::getNames(__return_storage_ptr__,&this->fallback,(HeapType)local_20.id)
    ;
  }
  else {
    pcVar2 = *(char **)((long)&((_Var4._M_cur)->
                               super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>
                               ._M_storage._M_storage + 0x10);
    (__return_storage_ptr__->name).super_IString.str._M_len =
         *(size_t *)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>).
                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>.
                  _M_storage._M_storage + 8);
    (__return_storage_ptr__->name).super_IString.str._M_str = pcVar2;
    local_28._M_h = (__hashtable_alloc *)&__return_storage_ptr__->fieldNames;
    (__return_storage_ptr__->fieldNames)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->fieldNames)._M_h._M_bucket_count =
         *(size_type *)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>).
                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>.
                  _M_storage._M_storage + 0x20);
    (__return_storage_ptr__->fieldNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->fieldNames)._M_h._M_element_count =
         *(size_type *)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>).
                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>.
                  _M_storage._M_storage + 0x30);
    sVar3 = *(size_t *)
             ((long)&((_Var4._M_cur)->
                     super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
                     .super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>
                     ._M_storage._M_storage + 0x40);
    *(undefined8 *)&(__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy =
         *(undefined8 *)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>).
                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>.
                  _M_storage._M_storage + 0x38);
    (__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy._M_next_resize = sVar3;
    (__return_storage_ptr__->fieldNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_28._M_h,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)((long)&((_Var4._M_cur)->
                          super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>
                          ._M_storage._M_storage + 0x18),&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
      if (parent.currModule) {
        if (auto it = parent.currModule->typeNames.find(type);
            it != parent.currModule->typeNames.end()) {
          return it->second;
        }
        // In principle we should always have at least a fallback name for every
        // type in the module, so this lookup should never fail. In practice,
        // though, the `printExpression` variants deliberately avoid walking the
        // module to find unnamed types so they can be safely used in a
        // function-parallel context. That means we can have a module but not
        // have generated the fallback names, so this lookup can fail, in which
        // case we generate a name on demand.
        if (auto it = fallbackNames.find(type); it != fallbackNames.end()) {
          return it->second;
        }
      }
      return fallback.getNames(type);
    }